

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

void ctl_refresh(tsdn_t *tsdn)

{
  background_thread_stats_t *stats;
  ctl_arena_t *ctl_sdarena;
  ctl_arena_stats_t *pcVar1;
  arena_t *arena;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ctl_stats_t *pcVar9;
  _Bool _Var10;
  int iVar11;
  ulong uVar12;
  ctl_arena_t *pcVar13;
  void *pvVar14;
  mutex_prof_data_t *data;
  size_t i;
  char *in_FS_OFFSET;
  undefined8 uStack_30;
  
  if (*in_FS_OFFSET != '\0') {
    uStack_30 = 0x11e13a;
    tsd_fetch_slow(*(tsd_t **)in_FS_OFFSET,false);
  }
  ctl_sdarena = ctl_arenas->arenas[0];
  lVar2 = -((ulong)ctl_arenas->narenas * 8 + 0xf & 0xfffffffffffffff0);
  ctl_sdarena->nthreads = 0;
  ctl_sdarena->dss = dss_prec_names[3];
  *(undefined4 *)&ctl_sdarena->dirty_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&ctl_sdarena->dirty_decay_ms + 4) = 0xffffffff;
  *(undefined4 *)&ctl_sdarena->muzzy_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&ctl_sdarena->muzzy_decay_ms + 4) = 0xffffffff;
  ctl_sdarena->pactive = 0;
  ctl_sdarena->pdirty = 0;
  ctl_sdarena->pmuzzy = 0;
  pcVar1 = ctl_sdarena->astats;
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x11df04;
  memset(pcVar1,0,0x27a8);
  pcVar1 = ctl_sdarena->astats;
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x11df17;
  memset(&pcVar1->allocated_small,0,0x1470);
  pcVar1 = ctl_sdarena->astats;
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x11df2c;
  memset(pcVar1->lstats,0,0x24c0);
  pcVar1 = ctl_sdarena->astats;
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x11df41;
  memset(pcVar1->estats,0,0x2550);
  if (ctl_arenas->narenas != 0) {
    uVar12 = 0;
    do {
      pvVar14 = arenas[uVar12].repr;
      if (pvVar14 == (void *)0x0) {
        pvVar14 = (void *)0x0;
      }
      *(void **)(&stack0xffffffffffffffd8 + uVar12 * 8 + lVar2 + -0x28 + 0x28) = pvVar14;
      uVar12 = uVar12 + 1;
    } while (uVar12 < ctl_arenas->narenas);
  }
  if (ctl_arenas->narenas != 0) {
    i = 0;
    do {
      *(undefined8 *)((long)&uStack_30 + lVar2) = 0x11df94;
      pcVar13 = arenas_i(i);
      arena = *(arena_t **)(&stack0xffffffffffffffd8 + i * 8 + lVar2 + -0x28 + 0x28);
      pcVar13->initialized = arena != (arena_t *)0x0;
      if (arena != (arena_t *)0x0) {
        *(undefined8 *)((long)&uStack_30 + lVar2) = 0x11dfb2;
        ctl_arena_refresh(tsdn,arena,ctl_sdarena,(uint)i,false);
      }
      i = i + 1;
    } while (i < ctl_arenas->narenas);
  }
  pcVar9 = ctl_stats;
  pcVar1 = ctl_sdarena->astats;
  ctl_stats->allocated = (pcVar1->astats).allocated_large.repr + pcVar1->allocated_small;
  pcVar9->active = ctl_sdarena->pactive << 0xc;
  pcVar9->metadata = (pcVar1->astats).internal.repr + (pcVar1->astats).base.repr;
  pcVar9->metadata_thp = (pcVar1->astats).metadata_thp.repr;
  pcVar9->resident = (pcVar1->astats).resident.repr;
  pcVar9->mapped = (pcVar1->astats).mapped.repr;
  pcVar9->retained = (pcVar1->astats).retained.repr;
  stats = &pcVar9->background_thread;
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x11e026;
  _Var10 = background_thread_stats_read(tsdn,stats);
  if (_Var10) {
    stats->num_threads = 0;
    stats->num_runs = 0;
    (pcVar9->background_thread).run_interval.ns = 0;
    *(undefined8 *)((long)&uStack_30 + lVar2) = 0x11e049;
    nstime_init(&(pcVar9->background_thread).run_interval,0);
  }
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x11e05c;
  iVar11 = pthread_mutex_trylock((pthread_mutex_t *)((long)&background_thread_lock.field_0 + 0x40));
  if (iVar11 != 0) {
    *(undefined8 *)((long)&uStack_30 + lVar2) = 0x11e068;
    malloc_mutex_lock_slow(&background_thread_lock);
  }
  pcVar9 = ctl_stats;
  uVar7 = background_thread_lock.field_0.witness.link.qre_next;
  uVar6 = background_thread_lock.field_0.field_0.prof_data.n_spin_acquired;
  uVar5 = background_thread_lock.field_0.field_0.prof_data.n_wait_times;
  uVar4 = background_thread_lock.field_0.field_0.prof_data.max_wait_time.ns;
  uVar3 = background_thread_lock.field_0.field_0.prof_data.tot_wait_time.ns;
  background_thread_lock.field_0.field_0.prof_data.n_lock_ops =
       background_thread_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (background_thread_lock.field_0.field_0.prof_data.prev_owner != tsdn) {
    background_thread_lock.field_0.witness.link.qre_prev =
         (witness_t *)(background_thread_lock.field_0.field_0.prof_data.n_owner_switches + 1);
    background_thread_lock.field_0.field_0.prof_data.prev_owner = tsdn;
  }
  uVar8 = background_thread_lock.field_0.field_0.prof_data.n_owner_switches;
  ctl_stats->mutex_prof_data[0].prev_owner =
       background_thread_lock.field_0.field_0.prof_data.prev_owner;
  pcVar9->mutex_prof_data[0].n_lock_ops =
       background_thread_lock.field_0.field_0.prof_data.n_lock_ops;
  *(undefined8 *)&pcVar9->mutex_prof_data[0].max_n_thds = uVar7;
  pcVar9->mutex_prof_data[0].n_owner_switches = uVar8;
  pcVar9->mutex_prof_data[0].n_wait_times = uVar5;
  pcVar9->mutex_prof_data[0].n_spin_acquired = uVar6;
  pcVar9->mutex_prof_data[0].tot_wait_time.ns = uVar3;
  pcVar9->mutex_prof_data[0].max_wait_time.ns = uVar4;
  pcVar9->mutex_prof_data[0].n_waiting_thds.repr = 0;
  background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  *(undefined8 *)((long)&uStack_30 + lVar2) = 0x11e0ca;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&background_thread_lock.field_0 + 0x40));
  pcVar9 = ctl_stats;
  uVar3 = ctl_mtx.field_0.field_0.prof_data.max_wait_time.ns;
  ctl_stats->mutex_prof_data[1].tot_wait_time.ns =
       (uint64_t)ctl_mtx.field_0.field_0.prof_data.tot_wait_time.ns;
  pcVar9->mutex_prof_data[1].max_wait_time.ns = uVar3;
  uVar3 = ctl_mtx.field_0.field_0.prof_data.n_spin_acquired;
  pcVar9->mutex_prof_data[1].n_wait_times = ctl_mtx.field_0.field_0.prof_data.n_wait_times;
  pcVar9->mutex_prof_data[1].n_spin_acquired = uVar3;
  uVar3 = ctl_mtx.field_0.field_0.prof_data.n_owner_switches;
  *(witness_t **)&pcVar9->mutex_prof_data[1].max_n_thds = ctl_mtx.field_0.witness.link.qre_next;
  pcVar9->mutex_prof_data[1].n_owner_switches = uVar3;
  uVar3 = ctl_mtx.field_0.field_0.prof_data.n_lock_ops;
  pcVar9->mutex_prof_data[1].prev_owner = ctl_mtx.field_0.field_0.prof_data.prev_owner;
  pcVar9->mutex_prof_data[1].n_lock_ops = uVar3;
  pcVar9->mutex_prof_data[1].n_waiting_thds.repr = 0;
  ctl_arenas->epoch = ctl_arenas->epoch + 1;
  return;
}

Assistant:

static void
ctl_refresh(tsdn_t *tsdn) {
	unsigned i;
	ctl_arena_t *ctl_sarena = arenas_i(MALLCTL_ARENAS_ALL);
	VARIABLE_ARRAY(arena_t *, tarenas, ctl_arenas->narenas);

	/*
	 * Clear sum stats, since they will be merged into by
	 * ctl_arena_refresh().
	 */
	ctl_arena_clear(ctl_sarena);

	for (i = 0; i < ctl_arenas->narenas; i++) {
		tarenas[i] = arena_get(tsdn, i, false);
	}

	for (i = 0; i < ctl_arenas->narenas; i++) {
		ctl_arena_t *ctl_arena = arenas_i(i);
		bool initialized = (tarenas[i] != NULL);

		ctl_arena->initialized = initialized;
		if (initialized) {
			ctl_arena_refresh(tsdn, tarenas[i], ctl_sarena, i,
			    false);
		}
	}

	if (config_stats) {
		ctl_stats->allocated = ctl_sarena->astats->allocated_small +
		    atomic_load_zu(&ctl_sarena->astats->astats.allocated_large,
			ATOMIC_RELAXED);
		ctl_stats->active = (ctl_sarena->pactive << LG_PAGE);
		ctl_stats->metadata = atomic_load_zu(
		    &ctl_sarena->astats->astats.base, ATOMIC_RELAXED) +
		    atomic_load_zu(&ctl_sarena->astats->astats.internal,
			ATOMIC_RELAXED);
		ctl_stats->metadata_thp = atomic_load_zu(
		    &ctl_sarena->astats->astats.metadata_thp, ATOMIC_RELAXED);
		ctl_stats->resident = atomic_load_zu(
		    &ctl_sarena->astats->astats.resident, ATOMIC_RELAXED);
		ctl_stats->mapped = atomic_load_zu(
		    &ctl_sarena->astats->astats.mapped, ATOMIC_RELAXED);
		ctl_stats->retained = atomic_load_zu(
		    &ctl_sarena->astats->astats.retained, ATOMIC_RELAXED);

		ctl_background_thread_stats_read(tsdn);

#define READ_GLOBAL_MUTEX_PROF_DATA(i, mtx)				\
    malloc_mutex_lock(tsdn, &mtx);					\
    malloc_mutex_prof_read(tsdn, &ctl_stats->mutex_prof_data[i], &mtx);	\
    malloc_mutex_unlock(tsdn, &mtx);

		if (config_prof && opt_prof) {
			READ_GLOBAL_MUTEX_PROF_DATA(global_prof_mutex_prof,
			    bt2gctx_mtx);
		}
		if (have_background_thread) {
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_background_thread,
			    background_thread_lock);
		} else {
			memset(&ctl_stats->mutex_prof_data[
			    global_prof_mutex_background_thread], 0,
			    sizeof(mutex_prof_data_t));
		}
		/* We own ctl mutex already. */
		malloc_mutex_prof_read(tsdn,
		    &ctl_stats->mutex_prof_data[global_prof_mutex_ctl],
		    &ctl_mtx);
#undef READ_GLOBAL_MUTEX_PROF_DATA
	}
	ctl_arenas->epoch++;
}